

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding_test.cc
# Opt level: O3

void leveldb::_Test_Varint32::_RunIt(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  char *limit;
  _Alloc_hider p;
  uint uStack_20c;
  string sStack_208;
  int iStack_1e8;
  uint uStack_1e4;
  char *pcStack_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1d8;
  Tester TStack_1d0;
  
  sStack_208._M_dataplus._M_p = (pointer)&sStack_208.field_2;
  sStack_208._M_string_length = 0;
  sStack_208.field_2._M_local_buf[0] = '\0';
  uVar2 = 0;
  do {
    PutVarint32(&sStack_208,(uVar2 >> 5) << ((byte)uVar2 & 0x1f));
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x400);
  paStack_1d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_208._M_dataplus._M_p;
  limit = sStack_208._M_dataplus._M_p + sStack_208._M_string_length;
  uVar2 = 0;
  p._M_p = sStack_208._M_dataplus._M_p;
  do {
    uStack_1e4 = (uVar2 >> 5) << ((byte)uVar2 & 0x1f);
    if ((p._M_p < limit) && (-1 < *p._M_p)) {
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(p._M_p + 1);
      uStack_20c = (int)*p._M_p;
    }
    else {
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)GetVarint32PtrFallback(p._M_p,limit,&uStack_20c);
    }
    TStack_1d0.ok_ = true;
    TStack_1d0.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
    ;
    TStack_1d0.line_ = 0x5c;
    paStack_1d8 = paVar1;
    std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
    test::Tester::Is(&TStack_1d0,
                     paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)0x0,"p != nullptr");
    test::Tester::~Tester(&TStack_1d0);
    TStack_1d0.ok_ = true;
    TStack_1d0.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
    ;
    TStack_1d0.line_ = 0x5d;
    std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
    test::Tester::IsEq<unsigned_int,unsigned_int>(&TStack_1d0,&uStack_1e4,&uStack_20c);
    test::Tester::~Tester(&TStack_1d0);
    TStack_1d0.ok_ = true;
    TStack_1d0.fname_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
    ;
    TStack_1d0.line_ = 0x5e;
    std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
    iStack_1e8 = VarintLength((ulong)uStack_20c);
    pcStack_1e0 = paVar1->_M_local_buf + -(long)p._M_p;
    test::Tester::IsEq<int,long>(&TStack_1d0,&iStack_1e8,(long *)&pcStack_1e0);
    test::Tester::~Tester(&TStack_1d0);
    uVar2 = uVar2 + 1;
    p._M_p = (pointer)paVar1;
  } while (uVar2 != 0x400);
  TStack_1d0.ok_ = true;
  TStack_1d0.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/util/coding_test.cc"
  ;
  TStack_1d0.line_ = 0x60;
  std::__cxx11::stringstream::stringstream((stringstream *)&TStack_1d0.ss_);
  pcStack_1e0 = sStack_208._M_dataplus._M_p + sStack_208._M_string_length;
  test::Tester::IsEq<char_const*,char_const*>(&TStack_1d0,(char **)&paStack_1d8,&pcStack_1e0);
  test::Tester::~Tester(&TStack_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_208._M_dataplus._M_p != &sStack_208.field_2) {
    operator_delete(sStack_208._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Coding, Varint32) {
  std::string s;
  for (uint32_t i = 0; i < (32 * 32); i++) {
    uint32_t v = (i / 32) << (i % 32);
    PutVarint32(&s, v);
  }

  const char* p = s.data();
  const char* limit = p + s.size();
  for (uint32_t i = 0; i < (32 * 32); i++) {
    uint32_t expected = (i / 32) << (i % 32);
    uint32_t actual;
    const char* start = p;
    p = GetVarint32Ptr(p, limit, &actual);
    ASSERT_TRUE(p != nullptr);
    ASSERT_EQ(expected, actual);
    ASSERT_EQ(VarintLength(actual), p - start);
  }
  ASSERT_EQ(p, s.data() + s.size());
}